

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O3

bool __thiscall
tlx::CmdlineParser::ArgumentBytes32::process(ArgumentBytes32 *this,int *argc,char ***argv)

{
  bool bVar1;
  ulong in_RAX;
  uint64_t dest;
  ulong local_28;
  
  if (*argc != 0) {
    local_28 = in_RAX;
    bVar1 = parse_si_iec_units(**argv,&local_28,'\0');
    if (!bVar1) {
      return false;
    }
    *this->dest_ = (uint32_t)local_28;
    if (local_28 >> 0x20 == 0) {
      *argc = *argc + -1;
      *argv = *argv + 1;
      return true;
    }
  }
  return false;
}

Assistant:

bool process(int& argc, const char* const*& argv) final { // NOLINT
        if (argc == 0)
            return false;
        uint64_t dest;
        if (parse_si_iec_units(argv[0], &dest) &&
            static_cast<uint64_t>(
                dest_ = static_cast<uint32_t>(dest)) == dest) {
            --argc, ++argv;
            return true;
        }
        else {
            return false;
        }
    }